

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void sendNode<cpprofiler::Node&>(Node *node)

{
  char cVar1;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int in_ESI;
  int in_R8D;
  
  if (so.print_nodes) {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::ofstream::open(node_stream,0x1b16f8);
    }
    in_ESI = 0x1f5298;
    printNode<cpprofiler::Node&>(node,(ostream *)node_stream);
    in_RDX = extraout_RDX;
    if (so.debug == true) {
      in_ESI = 0x1f6490;
      printNode<cpprofiler::Node&>(node,(ostream *)&std::cerr);
      in_RDX = extraout_RDX_00;
    }
  }
  cpprofiler::Node::send(node,in_ESI,in_RDX,in_RCX,in_R8D);
  return;
}

Assistant:

static void sendNode(T&& node) {
	if (so.print_nodes) {
		if (!node_stream.is_open()) {
			node_stream.open("node-log.log");
		}
		printNode(node, node_stream);
		if (so.debug) {
			printNode(node, std::cerr);
		}
	}
	node.send();
}